

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_tracemc(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  GCtrace *pGVar3;
  GCstr *pGVar4;
  
  pGVar3 = jit_checktrace(L);
  iVar2 = 0;
  if ((pGVar3 != (GCtrace *)0x0) && (pGVar3->mcode != (MCode *)0x0)) {
    pTVar1 = L->top;
    pGVar4 = lj_str_new(L,(char *)pGVar3->mcode,(ulong)pGVar3->szmcode);
    pTVar1[-1].u32.lo = (uint32_t)pGVar4;
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffffb;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(long)pGVar3->mcode;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(int)pGVar3->mcloop;
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}